

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O0

pboolean p_ini_file_parse(PIniFile *file,PError **error)

{
  PErrorIO code;
  pint native_code;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  pchar *__s;
  size_t sVar3;
  pchar *ppVar4;
  PList *pPVar5;
  PIniParameter *data;
  int local_c7c;
  pchar local_c78 [4];
  pint bom_shift;
  pchar value [1025];
  pchar local_868 [8];
  pchar key [1025];
  char local_458 [8];
  pchar src_line [1025];
  pchar *tmp_str;
  pchar *dst_line;
  FILE *in_file;
  PIniParameter *param;
  PIniSection *section;
  PError **error_local;
  PIniFile *file_local;
  
  if (file == (PIniFile *)0x0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    file_local._4_4_ = 0;
  }
  else if (file->is_parsed == 0) {
    __stream = fopen(file->path,"r");
    if (__stream == (FILE *)0x0) {
      code = p_error_get_last_io();
      native_code = p_error_get_last_system();
      p_error_set_error_p(error,code,native_code,"Failed to open file for reading");
      file_local._4_4_ = 0;
    }
    else {
      param = (PIniParameter *)0x0;
      memset(local_458,0,0x401);
      while (pcVar2 = fgets(local_458,0x401,__stream), pcVar2 != (char *)0x0) {
        if (((local_458[0] == -0x11) && (local_458[1] == -0x45)) && (local_458[2] == -0x41)) {
          local_c7c = 3;
        }
        else if (((local_458[0] == -2) && (local_458[1] == -1)) ||
                ((local_458[0] == -1 && (local_458[1] == -2)))) {
          local_c7c = 2;
        }
        else if (((local_458[0] == '\0') && (local_458[1] == '\0')) &&
                ((local_458[2] == -2 && (local_458[3] == -1)))) {
          local_c7c = 4;
        }
        else if ((((local_458[0] == -1) && (local_458[1] == -2)) && (local_458[2] == '\0')) &&
                (local_458[3] == '\0')) {
          local_c7c = 4;
        }
        else {
          local_c7c = 0;
        }
        __s = p_strchomp(local_458 + local_c7c);
        if (__s != (pchar *)0x0) {
          sVar3 = strlen(__s);
          if (0x400 < sVar3) {
            __s[0x400] = '\0';
          }
          if (((*__s == '[') && (sVar3 = strlen(__s), __s[sVar3 - 1] == ']')) &&
             (iVar1 = __isoc99_sscanf(__s,"[%[^]]",local_868), iVar1 == 1)) {
            ppVar4 = p_strchomp(local_868);
            if (ppVar4 != (pchar *)0x0) {
              sVar3 = strlen(ppVar4);
              if (0x400 < sVar3) {
                ppVar4[0x400] = '\0';
              }
              strcpy(local_868,ppVar4);
              p_free(ppVar4);
              if (param != (PIniParameter *)0x0) {
                if (param->value == (pchar *)0x0) {
                  pp_ini_file_section_free((PIniSection *)param);
                }
                else {
                  pPVar5 = p_list_prepend(file->sections,param);
                  file->sections = pPVar5;
                }
              }
              param = (PIniParameter *)pp_ini_file_section_new(local_868);
            }
          }
          else {
            iVar1 = __isoc99_sscanf(__s,"%[^=] = \"%[^\"]\"",local_868,local_c78);
            if ((((iVar1 == 2) ||
                 (iVar1 = __isoc99_sscanf(__s,"%[^=] = \'%[^\']\'",local_868,local_c78), iVar1 == 2)
                 ) || (iVar1 = __isoc99_sscanf(__s,"%[^=] = %[^;#]",local_868,local_c78), iVar1 == 2
                      )) && (ppVar4 = p_strchomp(local_868), ppVar4 != (pchar *)0x0)) {
              sVar3 = strlen(ppVar4);
              if (0x400 < sVar3) {
                ppVar4[0x400] = '\0';
              }
              strcpy(local_868,ppVar4);
              p_free(ppVar4);
              ppVar4 = p_strchomp(local_c78);
              if (ppVar4 != (pchar *)0x0) {
                sVar3 = strlen(ppVar4);
                if (0x400 < sVar3) {
                  ppVar4[0x400] = '\0';
                }
                strcpy(local_c78,ppVar4);
                p_free(ppVar4);
                iVar1 = strcmp(local_c78,"\"\"");
                if ((iVar1 == 0) || (iVar1 = strcmp(local_c78,"\'\'"), iVar1 == 0)) {
                  local_c78[0] = '\0';
                }
                if ((param != (PIniParameter *)0x0) &&
                   (data = pp_ini_file_parameter_new(local_868,local_c78),
                   data != (PIniParameter *)0x0)) {
                  pPVar5 = p_list_prepend((PList *)param->value,data);
                  param->value = (pchar *)pPVar5;
                }
              }
            }
          }
          p_free(__s);
          memset(local_458,0,0x401);
        }
      }
      if (param != (PIniParameter *)0x0) {
        if (param->value == (pchar *)0x0) {
          pp_ini_file_section_free((PIniSection *)param);
        }
        else {
          pPVar5 = p_list_append(file->sections,param);
          file->sections = pPVar5;
        }
      }
      iVar1 = fclose(__stream);
      if (iVar1 != 0) {
        printf("** Warning: %s **\n","PIniFile::p_ini_file_parse: fclose() failed");
      }
      file->is_parsed = 1;
      file_local._4_4_ = 1;
    }
  }
  else {
    file_local._4_4_ = 1;
  }
  return file_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_ini_file_parse (PIniFile	*file,
		  PError	**error)
{
	PIniSection	*section;
	PIniParameter	*param;
	FILE		*in_file;
	pchar		*dst_line;
	pchar		*tmp_str;
	pchar		src_line[P_INI_FILE_MAX_LINE + 1];
	pchar		key[P_INI_FILE_MAX_LINE + 1];
	pchar		value[P_INI_FILE_MAX_LINE + 1];
	pint		bom_shift;

	if (P_UNLIKELY (file == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (file->is_parsed)
		return TRUE;

	if (P_UNLIKELY ((in_file = fopen (file->path, "r")) == NULL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to open file for reading");
		return FALSE;
	}

	dst_line = NULL;
	section  = NULL;
	param    = NULL;

	memset (src_line, 0, sizeof (src_line));

	while (fgets (src_line, sizeof (src_line), in_file) != NULL) {
		/* UTF-8, UTF-16 and UTF-32 BOM detection */
		if ((puchar) src_line[0] == 0xEF && (puchar) src_line[1] == 0xBB && (puchar) src_line[2] == 0xBF)
			bom_shift = 3;
		else if (((puchar) src_line[0] == 0xFE && (puchar) src_line[1] == 0xFF) ||
			 ((puchar) src_line[0] == 0xFF && (puchar) src_line[1] == 0xFE))
			bom_shift = 2;
		else if ((puchar) src_line[0] == 0x00 && (puchar) src_line[1] == 0x00 &&
			 (puchar) src_line[2] == 0xFE && (puchar) src_line[3] == 0xFF)
			bom_shift = 4;
		else if ((puchar) src_line[0] == 0xFF && (puchar) src_line[1] == 0xFE &&
			 (puchar) src_line[2] == 0x00 && (puchar) src_line[3] == 0x00)
			bom_shift = 4;
		else
			bom_shift = 0;

		dst_line = p_strchomp (src_line + bom_shift);

		if (dst_line == NULL)
			continue;

		/* This should not happen */
		if (P_UNLIKELY (strlen (dst_line) > P_INI_FILE_MAX_LINE))
			dst_line[P_INI_FILE_MAX_LINE] = '\0';

		if (dst_line[0] == '[' && dst_line[strlen (dst_line) - 1] == ']' &&
		    sscanf (dst_line, "[%[^]]", key) == 1) {
			/* New section found */
			if ((tmp_str = p_strchomp (key)) != NULL) {
				/* This should not happen */
				if (P_UNLIKELY (strlen (tmp_str) > P_INI_FILE_MAX_LINE))
					tmp_str[P_INI_FILE_MAX_LINE] = '\0';

				strcpy (key, tmp_str);
				p_free (tmp_str);

				if (section != NULL) {
					if (section->keys == NULL)
						pp_ini_file_section_free (section);
					else
						file->sections = p_list_prepend (file->sections, section);
				}

				section = pp_ini_file_section_new (key);
			}
		} else if (sscanf (dst_line, "%[^=] = \"%[^\"]\"", key, value) == 2 ||
			   sscanf (dst_line, "%[^=] = '%[^\']'", key, value) == 2 ||
			   sscanf (dst_line, "%[^=] = %[^;#]", key, value) == 2) {
			/* New parameter found */
			if ((tmp_str = p_strchomp (key)) != NULL) {
				/* This should not happen */
				if (P_UNLIKELY (strlen (tmp_str) > P_INI_FILE_MAX_LINE))
					tmp_str[P_INI_FILE_MAX_LINE] = '\0';

				strcpy (key, tmp_str);
				p_free (tmp_str);

				if ((tmp_str = p_strchomp (value)) != NULL) {
					/* This should not happen */
					if (P_UNLIKELY (strlen (tmp_str) > P_INI_FILE_MAX_LINE))
						tmp_str[P_INI_FILE_MAX_LINE] = '\0';

					strcpy (value, tmp_str);
					p_free (tmp_str);

					if (strcmp (value, "\"\"") == 0 || (strcmp (value, "''") == 0))
						value[0] = '\0';

					if (section != NULL && (param = pp_ini_file_parameter_new (key, value)) != NULL)
						section->keys = p_list_prepend (section->keys, param);
				}
			}
		}

		p_free (dst_line);
		memset (src_line, 0, sizeof (src_line));
	}

	if (section != NULL) {
		if (section->keys == NULL)
			pp_ini_file_section_free (section);
		else
			file->sections = p_list_append (file->sections, section);
	}

	if (P_UNLIKELY (fclose (in_file) != 0))
		P_WARNING ("PIniFile::p_ini_file_parse: fclose() failed");

	file->is_parsed = TRUE;

	return TRUE;
}